

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void m2d::savanna::load_root_cert(string *cert,context *ctx)

{
  error_code ec_00;
  error_category *this;
  bool bVar1;
  void *data;
  size_t size_in_bytes;
  system_error *this_00;
  const_buffer local_38;
  undefined1 auStack_28 [8];
  error_code ec;
  context *ctx_local;
  string *cert_local;
  
  ec.cat_ = (error_category *)ctx;
  boost::system::error_code::error_code((error_code *)auStack_28);
  this = ec.cat_;
  data = (void *)std::__cxx11::string::data();
  size_in_bytes = std::__cxx11::string::size();
  local_38 = (const_buffer)boost::asio::buffer(data,size_in_bytes);
  boost::asio::ssl::context::add_certificate_authority
            ((context *)this,&local_38,(error_code *)auStack_28);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_28);
  if (!bVar1) {
    boost::asio::ssl::context::set_verify_mode((context *)ec.cat_,1);
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  ec_00.cat_ = (error_category *)ec._0_8_;
  ec_00.val_ = auStack_28._0_4_;
  ec_00.failed_ = (bool)auStack_28[4];
  ec_00._5_3_ = auStack_28._5_3_;
  boost::system::system_error::system_error(this_00,ec_00);
  __cxa_throw(this_00,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

static void load_root_cert(std::string const &cert, ssl::context &ctx)
	{
		boost::system::error_code ec;
		ctx.add_certificate_authority(boost::asio::buffer(cert.data(), cert.size()), ec);
		if (ec) {
			throw beast::system_error { ec };
		}

		ctx.set_verify_mode(ssl::verify_peer);
	}